

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void do_change_mode_proc(Am_Object *cmd)

{
  byte bVar1;
  Am_Value *pAVar2;
  Am_String *pAVar3;
  Am_Value_List *pAVar4;
  Am_Wrapper *pAVar5;
  Am_String local_60;
  Am_String local_58;
  Am_Value_List local_50 [16];
  Am_Value_List local_40 [16];
  Am_Gesture_Classifier local_30 [8];
  Am_Gesture_Classifier cl;
  Am_String local_18;
  Am_String new_mode;
  Am_Object *cmd_local;
  
  new_mode.data = (Am_String_Data *)cmd;
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
  Am_String::Am_String(&local_18,pAVar2);
  bVar1 = Am_String::operator==(&local_18,(Am_String *)&training_mode);
  if ((bVar1 & 1) == 0) {
    Am_Gesture_Trainer::Train();
    bVar1 = Am_Gesture_Classifier::Trained();
    if ((bVar1 & 1) == 0) {
      Am_Value_List::Am_Value_List(local_50);
      Am_String::Am_String(&local_58,"This classifier can\'t recognize anything.",true);
      pAVar3 = (Am_String *)
               Am_Value_List::Add((Am_String *)local_50,(Am_Add_Position)&local_58,true);
      Am_String::Am_String(&local_60,"Please provide more examples.",true);
      pAVar4 = (Am_Value_List *)Am_Value_List::Add(pAVar3,(Am_Add_Position)&local_60,true);
      Am_Value_List::Am_Value_List(local_40,pAVar4);
      Popup_Error(local_40);
      Am_Value_List::~Am_Value_List(local_40);
      Am_String::~Am_String(&local_60);
      Am_String::~Am_String(&local_58);
      Am_Value_List::~Am_Value_List(local_50);
      Am_Object::Set(0x5560,(Am_String *)0x169,0x115570);
    }
    else {
      pAVar5 = Am_Gesture_Classifier::operator_cast_to_Am_Wrapper_(local_30);
      Am_Object::Set(0x5548,(Am_Wrapper *)0x140,(ulong)pAVar5);
    }
    Am_Gesture_Classifier::~Am_Gesture_Classifier(local_30);
  }
  else {
    Am_Object::Set(0x5548,0x140,0);
  }
  Am_String::~Am_String(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_change_mode, (Am_Object cmd))
{
  Am_String new_mode = cmd.Get(Am_VALUE);

  if (new_mode == training_mode) {
    gesture_inter.Set(Am_CLASSIFIER, 0);
  } else {
    Am_Gesture_Classifier cl = trainer.Train();

    if (!cl.Trained()) {
      Popup_Error(
          Am_Value_List()
              .Add(Am_String("This classifier can't recognize anything."))
              .Add(Am_String("Please provide more examples.")));
      // set the mode back
      mode.Set(Am_VALUE, training_mode);
    } else
      gesture_inter.Set(Am_CLASSIFIER, cl);
  }
}